

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O3

void __thiscall
spvtools::opt::LoopFissionPass::LoopFissionPass
          (LoopFissionPass *this,size_t register_threshold_to_split,bool split_multiple_times)

{
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__LoopFissionPass_003df578;
  this->split_multiple_times_ = split_multiple_times;
  *(size_t *)&(this->split_criteria_).super__Function_base._M_functor = register_threshold_to_split;
  *(undefined8 *)((long)&(this->split_criteria_).super__Function_base._M_functor + 8) = 0;
  (this->split_criteria_).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_spvtools::opt::RegisterLiveness::RegionRegisterLiveness_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fission.cpp:426:7)>
       ::_M_manager;
  (this->split_criteria_)._M_invoker =
       std::
       _Function_handler<bool_(const_spvtools::opt::RegisterLiveness::RegionRegisterLiveness_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fission.cpp:426:7)>
       ::_M_invoke;
  return;
}

Assistant:

LoopFissionPass::LoopFissionPass(const size_t register_threshold_to_split,
                                 bool split_multiple_times)
    : split_multiple_times_(split_multiple_times) {
  // Split if the number of registers in the loop exceeds
  // |register_threshold_to_split|.
  split_criteria_ =
      [register_threshold_to_split](
          const RegisterLiveness::RegionRegisterLiveness& liveness) {
        return liveness.used_registers_ > register_threshold_to_split;
      };
}